

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

char __thiscall
cs_impl::
cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
::_call<0>(cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  char cVar1;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *psVar2;
  
  psVar2 = try_convert_and_check<std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    cVar1 = (*(this->mFunc)._M_invoker)((_Any_data *)this,psVar2);
    return cVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}